

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int * int_list_dup(int *aa)

{
  int *piVar1;
  long lVar2;
  size_t __size;
  
  __size = 0;
  do {
    piVar1 = (int *)((long)aa + __size);
    __size = __size + 4;
  } while (*piVar1 != -1);
  piVar1 = (int *)malloc(__size);
  for (lVar2 = 0; *(int *)((long)aa + lVar2) != -1; lVar2 = lVar2 + 4) {
    *(int *)((long)piVar1 + lVar2) = *(int *)((long)aa + lVar2);
  }
  *(undefined4 *)((long)piVar1 + lVar2) = 0xffffffff;
  return piVar1;
}

Assistant:

int *int_list_dup(int *aa) {
  int *a = aa, *b, *bb;
  while (*a != -1) {
    a++;
  }
  bb = b = (int *)MALLOC((a - aa + 1) * sizeof(int));
  a = aa;
  while (*a != -1) {
    *b++ = *a++;
  }
  *b++ = -1;
  return bb;
}